

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psac.cpp
# Opt level: O2

bool check_sa_dss<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,true>
               (suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                *sa,string *str,comm *c)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  bool bVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> gsa;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> _Stack_28;
  
  mxx::gatherv<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_28,&sa->local_SA,0,c);
  bVar1 = true;
  if (c->m_rank == 0) {
    begin._M_current = (str->_M_dataplus)._M_p;
    bVar1 = dss::check<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long>
                      (begin,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(begin._M_current + str->_M_string_length),
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_28);
  }
  bVar1 = mxx::all_of(bVar1,c);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&_Stack_28);
  return bVar1;
}

Assistant:

bool check_sa_dss(suffix_array<Iterator, index_t, _LCP>& sa, const std::string& str, const mxx::comm& c) {
    // gather SA back to root process
    std::vector<index_t> gsa = mxx::gatherv(sa.local_SA, 0, c);

    // check correctness using dss
    bool dss_correct = true;
    if (c.rank() == 0) {
        dss_correct = dss::check(str.begin(), str.end(), gsa);
    }

    return mxx::all_of(dss_correct, c);

    // check correctness using own method
    // TODO return bool value instead of exit(FAILURE) in that function
    //bool correct = gl_check_correct(sa, local_str.begin(), local_str.end(), c);
}